

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::cleanup::ChunkList::Cleanup(ChunkList *this,SerialArena *arena)

{
  CleanupNode *pCVar1;
  uint uVar2;
  ulong uVar3;
  Chunk *pCVar4;
  CleanupNode *pCVar5;
  Chunk *pCVar6;
  code *pcVar7;
  CleanupNode *pCVar8;
  bool bVar9;
  
  if (this->head_ == (Chunk *)0x0) {
    return;
  }
  uVar3 = (arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar3 == 0) {
    pcVar7 = (code *)0x0;
  }
  else {
    pcVar7 = *(code **)(uVar3 + 0x18);
  }
  pCVar8 = this->next_;
  pCVar4 = this->head_;
  do {
    pCVar8 = pCVar8 + -1;
    pCVar1 = (CleanupNode *)(pCVar4 + 1);
    pCVar5 = pCVar8;
    if (pCVar1 <= pCVar8) {
      uVar2 = 0;
      do {
        pCVar5 = pCVar5 + -1;
        if (pCVar5 < pCVar1) break;
        bVar9 = uVar2 < 7;
        uVar2 = uVar2 + 1;
      } while (bVar9);
    }
    for (; pCVar1 <= pCVar5; pCVar5 = pCVar5 + -1) {
      (*pCVar8->destructor)((Chunk *)pCVar8->elem);
      pCVar8 = pCVar8 + -1;
    }
    pCVar6 = pCVar4->next;
    if (pCVar1 <= pCVar8) {
      do {
        (*pCVar8->destructor)((Chunk *)pCVar8->elem);
        pCVar8 = pCVar8 + -1;
      } while (pCVar1 <= pCVar8);
      pCVar6 = pCVar4->next;
    }
    if (pcVar7 == (code *)0x0) {
      operator_delete(pCVar4,pCVar4->size);
    }
    else {
      (*pcVar7)();
    }
    if (pCVar6 == (Chunk *)0x0) {
      return;
    }
    pCVar8 = (CleanupNode *)((long)&pCVar6[1].next + (pCVar6->size - 0x10 & 0xfffffffffffffff0));
    pCVar4 = pCVar6;
  } while( true );
}

Assistant:

void ChunkList::Cleanup(const SerialArena& arena) {
  Chunk* c = head_;
  if (c == nullptr) return;
  GetDeallocator deallocator(arena.parent_.AllocPolicy());

  // Iterate backwards in order to destroy in the right order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    // A prefetch distance of 8 here was chosen arbitrarily.
    constexpr int kPrefetchDistance = 8;
    CleanupNode* prefetch = it;
    // Prefetch the first kPrefetchDistance nodes.
    for (int i = 0; prefetch >= first && i < kPrefetchDistance;
         --prefetch, ++i) {
      prefetch->Prefetch();
    }
    // For the middle nodes, run destructor and prefetch the node
    // kPrefetchDistance after the current one.
    for (; prefetch >= first; --it, --prefetch) {
      it->Destroy();
      prefetch->Prefetch();
    }
    // Note: we could consider prefetching `next` chunk earlier.
    absl::PrefetchToLocalCacheNta(c->next);
    // Destroy the rest without prefetching.
    for (; it >= first; --it) {
      it->Destroy();
    }
    Chunk* next = c->next;
    deallocator({c, c->size});
    if (next == nullptr) return;
    c = next;
    it = c->Last();
  };
}